

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::LoadRepositories(cmCTestSVN *this)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_2f8 [8];
  OutputLogger err;
  ExternalParser out;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  svn_status;
  cmCTestSVN *this_local;
  
  svn_status.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::empty
                    (&this->Repositories);
  if (bVar1) {
    std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::emplace_back<>
              (&this->Repositories);
    pvVar2 = std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::back
                       (&this->Repositories);
    this->RootInfo = pvVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[7]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_30,
               (char (*) [7])0x11050ec);
    ExternalParser::ExternalParser
              ((ExternalParser *)&err.super_LineParser.Separator,this,"external-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)local_2f8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "external-err> ");
    this_local._7_1_ =
         RunSVNCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_30,(OutputParser *)&err.super_LineParser.Separator,
                       (OutputParser *)local_2f8);
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_2f8);
    ExternalParser::~ExternalParser((ExternalParser *)&err.super_LineParser.Separator);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_30);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestSVN::LoadRepositories()
{
  if (!this->Repositories.empty()) {
    return true;
  }

  // Info for root repository
  this->Repositories.emplace_back();
  this->RootInfo = &(this->Repositories.back());

  // Run "svn status" to get the list of external repositories
  std::vector<std::string> svn_status;
  svn_status.emplace_back("status");
  ExternalParser out(this, "external-out> ");
  OutputLogger err(this->Log, "external-err> ");
  return this->RunSVNCommand(svn_status, &out, &err);
}